

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::getSamples
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,int *iterations,
          vector<int,_std::allocator<int>_> *samples)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  undefined8 in_RDX;
  int *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_00000010;
  int iter;
  size_type in_stack_ffffffffffffffc8;
  int local_1c;
  
  peVar4 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6f1276);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(peVar4);
  iVar2 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
  pFVar1 = _stderr;
  if (sVar5 < (ulong)(long)iVar2) {
    iVar2 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 8))();
    lVar6 = (long)iVar2;
    peVar4 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6f12cc);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(peVar4);
    fprintf(pFVar1,
            "[sm::SampleConsensusModel::getSamples] Can not select %zu unique points out of %zu!\n",
            lVar6,sVar5);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6f12f9);
    iVar2 = std::numeric_limits<int>::max();
    *in_RSI = iVar2;
  }
  else {
    (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + 8))();
    std::vector<int,_std::allocator<int>_>::resize(in_RDI,in_stack_ffffffffffffffc8);
    for (local_1c = 0; pFVar1 = _stdout,
        local_1c <
        *(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish; local_1c = local_1c + 1) {
      drawIndexSample(in_stack_00000010,in_stack_00000008);
      uVar7 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 6))(in_RDI,in_RDX);
      if ((uVar7 & 1) != 0) {
        return;
      }
    }
    uVar3 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 8))();
    fprintf(pFVar1,
            "[sm::SampleConsensusModel::getSamples] WARNING: Could not select %d sample points in %d iterations!\n"
            ,(ulong)uVar3,
            (ulong)*(uint *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6f13bb);
  }
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::getSamples(
    int &iterations, std::vector<int> &samples)
{
  // We're assuming that indices_ have already been set in the constructor
  if (indices_->size() < (size_t)getSampleSize())
  {
    fprintf( stderr,
        "[sm::SampleConsensusModel::getSamples] Can not select %zu unique points out of %zu!\n",
        (size_t) getSampleSize(), indices_->size() );
    // one of these will make it stop :)
    samples.clear();
    iterations = std::numeric_limits<int>::max();
    return;
  }

  // Get a second point which is different than the first
  samples.resize( getSampleSize() );

  for( int iter = 0; iter < max_sample_checks_; ++iter )
  {
    drawIndexSample(samples);

    // If it's a good sample, stop here
    if(isSampleGood(samples))
      return;
  }
  fprintf( stdout,
      "[sm::SampleConsensusModel::getSamples] WARNING: Could not select %d sample points in %d iterations!\n",
      getSampleSize(), max_sample_checks_ );
  samples.clear();

}